

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeField
                    (FieldDescriptor *field,Message *message,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  long lVar1;
  unsigned_long uVar2;
  bool bVar3;
  CppType CVar4;
  Type TVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Operation op;
  CppStringType CVar9;
  uint32_t uVar10;
  Reflection *this;
  MapFieldBase *this_00;
  reference pMVar11;
  MapKey *key;
  MapValueConstRef *value_17;
  Descriptor *pDVar12;
  MessageOptions *pMVar13;
  uint8_t *puVar14;
  RepeatedField<int> *pRVar15;
  const_pointer piVar16;
  RepeatedField<long> *pRVar17;
  size_t sVar18;
  const_pointer plVar19;
  RepeatedField<unsigned_int> *pRVar20;
  const_pointer puVar21;
  RepeatedField<unsigned_long> *pRVar22;
  const_pointer puVar23;
  byte *pbVar24;
  RepeatedField<float> *pRVar25;
  const_pointer data;
  RepeatedField<double> *pRVar26;
  const_pointer data_00;
  RepeatedField<bool> *rhs;
  const_pointer data_01;
  LogMessage *pLVar27;
  MessageLite *pMVar28;
  WireFormatLite *this_01;
  DescriptorStringView psVar29;
  char *data_02;
  size_t sVar30;
  void *pvVar31;
  const_pointer piVar32;
  size_t extraout_RDX;
  char *in_R9;
  string_view sVar33;
  string *local_1988;
  string *local_18e0;
  EnumValueDescriptor *local_18b0;
  bool local_1853;
  double local_1838;
  float local_180c;
  int64_t local_17e8;
  int32_t local_17bc;
  uint64_t local_1798;
  uint32_t local_176c;
  uint64_t local_1748;
  uint32_t local_171c;
  int64_t local_16f8;
  int32_t local_16cc;
  int64_t local_16a8;
  int32_t local_167c;
  string *value_15;
  string scratch_1;
  Cord value_16;
  string *value_14;
  string scratch;
  bool strict_utf8_check;
  EnumValueDescriptor *value_13;
  Message *msg_1;
  Message *msg;
  bool value_12;
  double value_11;
  float value_10;
  int64_t value_9;
  int32_t value_8;
  uint64_t value_7;
  uint32_t value_6;
  uint64_t value_5;
  uint32_t value_4;
  int64_t value_3;
  int32_t value_2;
  int64_t value_1;
  int32_t value;
  int j;
  anon_class_24_3_10f69874 get_message_from_field;
  Voidify local_f51;
  undefined1 local_f50 [8];
  RepeatedField<bool> r_13;
  RepeatedField<double> r_12;
  RepeatedField<float> r_11;
  RepeatedField<long> r_10;
  RepeatedField<int> r_9;
  RepeatedField<unsigned_long> r_8;
  RepeatedField<unsigned_int> r_7;
  RepeatedField<int> r_6;
  RepeatedField<unsigned_long> r_5;
  RepeatedField<unsigned_int> r_4;
  RepeatedField<long> r_3;
  RepeatedField<int> r_2;
  RepeatedField<long> r_1;
  RepeatedField<int> r;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  local_e68;
  undefined1 local_e50 [8];
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  map_entries;
  undefined1 local_e30 [4];
  int count;
  undefined1 local_dd8 [8];
  MapIterator it_1;
  undefined1 local_d70 [8];
  MapValueConstRef map_value;
  __normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
  local_d58;
  iterator it;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> sorted_key_list;
  MapFieldBase *map_field;
  Reflection *message_reflection;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  Message *message_local;
  FieldDescriptor *field_local;
  ptrdiff_t size_8;
  EpsCopyOutputStream *local_cd8;
  ptrdiff_t size_7;
  EpsCopyOutputStream *local_ca8;
  unsigned_long size;
  unsigned_long element_size;
  unsigned_long size_1;
  unsigned_long element_size_1;
  unsigned_long size_2;
  unsigned_long element_size_2;
  unsigned_long size_3;
  unsigned_long element_size_3;
  unsigned_long size_4;
  unsigned_long element_size_4;
  unsigned_long size_5;
  unsigned_long element_size_5;
  unsigned_long size_6;
  unsigned_long element_size_6;
  EpsCopyOutputStream *local_a38;
  uint local_a2c;
  EpsCopyOutputStream *local_a28;
  uint local_a1c;
  const_pointer end_6;
  const_pointer it_8;
  EpsCopyOutputStream *local_a00;
  byte *local_9d8;
  ulong local_9d0;
  const_pointer end;
  const_pointer it_2;
  EpsCopyOutputStream *local_9b0;
  byte *local_988;
  ulong local_980;
  basic_string_view<char,_std::char_traits<char>_> local_948;
  LogMessageFatal local_938 [23];
  Voidify local_921;
  byte *local_920;
  undefined4 local_918;
  int local_914;
  EpsCopyOutputStream *local_910;
  byte *local_908;
  uint local_8fc;
  byte *local_8f8;
  uint local_8f0;
  int local_8ec;
  EpsCopyOutputStream *local_8e8;
  byte local_8c9;
  basic_string_view<char,_std::char_traits<char>_> local_8c8;
  LogMessageFatal local_8b8 [23];
  Voidify local_8a1;
  byte *local_8a0;
  uint local_898;
  int local_894;
  EpsCopyOutputStream *local_890;
  byte *local_888;
  uint local_87c;
  byte *local_878;
  uint local_870;
  int local_86c;
  EpsCopyOutputStream *local_868;
  byte local_849;
  basic_string_view<char,_std::char_traits<char>_> local_848;
  LogMessageFatal local_838 [23];
  Voidify local_821;
  byte *local_820;
  uint local_818;
  int local_814;
  EpsCopyOutputStream *local_810;
  byte *local_808;
  uint local_7fc;
  byte *local_7f8;
  uint local_7f0;
  int local_7ec;
  EpsCopyOutputStream *local_7e8;
  byte local_7c9;
  basic_string_view<char,_std::char_traits<char>_> local_7c8;
  LogMessageFatal local_7b8 [23];
  Voidify local_7a1;
  byte *local_7a0;
  uint local_798;
  int local_794;
  EpsCopyOutputStream *local_790;
  byte *local_788;
  uint local_77c;
  byte *local_778;
  uint local_770;
  int local_76c;
  EpsCopyOutputStream *local_768;
  byte local_749;
  basic_string_view<char,_std::char_traits<char>_> local_748;
  LogMessageFatal local_738 [23];
  Voidify local_721;
  byte *local_720;
  uint local_718;
  int local_714;
  EpsCopyOutputStream *local_710;
  byte *local_708;
  uint local_6fc;
  byte *local_6f8;
  uint local_6f0;
  int local_6ec;
  EpsCopyOutputStream *local_6e8;
  byte local_6c9;
  basic_string_view<char,_std::char_traits<char>_> local_6c8;
  LogMessageFatal local_6b8 [23];
  Voidify local_6a1;
  byte *local_6a0;
  uint local_698;
  int local_694;
  EpsCopyOutputStream *local_690;
  byte *local_688;
  uint local_67c;
  byte *local_678;
  uint local_670;
  int local_66c;
  EpsCopyOutputStream *local_668;
  byte local_649;
  basic_string_view<char,_std::char_traits<char>_> local_648;
  LogMessageFatal local_638 [23];
  Voidify local_621;
  byte *local_620;
  uint local_618;
  int local_614;
  EpsCopyOutputStream *local_610;
  byte *local_608;
  uint local_5fc;
  byte *local_5f8;
  uint local_5f0;
  int local_5ec;
  EpsCopyOutputStream *local_5e8;
  byte local_5c9;
  basic_string_view<char,_std::char_traits<char>_> local_5c8;
  LogMessageFatal local_5b8 [23];
  Voidify local_5a1;
  byte *local_5a0;
  uint local_598;
  int local_594;
  EpsCopyOutputStream *local_590;
  byte *local_588;
  uint local_57c;
  byte *local_578;
  uint local_570;
  int local_56c;
  EpsCopyOutputStream *local_568;
  byte local_549;
  basic_string_view<char,_std::char_traits<char>_> local_548;
  LogMessageFatal local_538 [23];
  Voidify local_521;
  byte *local_520;
  uint local_518;
  int local_514;
  EpsCopyOutputStream *local_510;
  byte *local_508;
  uint local_4fc;
  byte *local_4f8;
  uint local_4ec;
  byte *local_4e8;
  uint local_4dc;
  byte *local_4d8;
  uint local_4cc;
  byte *local_4c8;
  uint local_4bc;
  byte *local_4b8;
  uint local_4ac;
  byte *local_4a8;
  uint local_49c;
  byte *local_498;
  uint local_48c;
  EpsCopyOutputStream *local_488;
  uint local_47c;
  EpsCopyOutputStream *local_478;
  uint local_46c;
  const_pointer local_468;
  const_pointer end_1;
  const_pointer it_3;
  EpsCopyOutputStream *local_450;
  uint local_444;
  RepeatedField<long> *local_440;
  int local_434;
  EpsCopyOutputStream *local_430;
  EpsCopyOutputStream *local_428;
  ulong local_420;
  byte *local_418;
  uint local_410;
  int local_40c;
  EpsCopyOutputStream *local_408;
  byte local_3e9;
  basic_string_view<char,_std::char_traits<char>_> local_3e8;
  LogMessageFatal local_3d8 [23];
  Voidify local_3c1;
  byte *local_3c0;
  uint local_3b8;
  int local_3b4;
  EpsCopyOutputStream *local_3b0;
  byte *local_3a8;
  uint local_39c;
  EpsCopyOutputStream *local_398;
  uint local_38c;
  const_pointer local_388;
  const_pointer end_2;
  const_pointer it_4;
  EpsCopyOutputStream *local_370;
  uint local_364;
  RepeatedField<int> *local_360;
  int local_354;
  EpsCopyOutputStream *local_350;
  EpsCopyOutputStream *local_348;
  uint local_33c;
  byte *local_338;
  uint local_330;
  int local_32c;
  EpsCopyOutputStream *local_328;
  byte local_309;
  basic_string_view<char,_std::char_traits<char>_> local_308;
  LogMessageFatal local_2f8 [23];
  Voidify local_2e1;
  byte *local_2e0;
  uint local_2d8;
  int local_2d4;
  EpsCopyOutputStream *local_2d0;
  byte *local_2c8;
  uint local_2bc;
  EpsCopyOutputStream *local_2b8;
  uint local_2ac;
  const_pointer local_2a8;
  const_pointer end_3;
  const_pointer it_5;
  EpsCopyOutputStream *local_290;
  uint local_284;
  RepeatedField<long> *local_280;
  int local_274;
  EpsCopyOutputStream *local_270;
  EpsCopyOutputStream *local_268;
  ulong local_260;
  byte *local_258;
  uint local_250;
  int local_24c;
  EpsCopyOutputStream *local_248;
  byte local_229;
  basic_string_view<char,_std::char_traits<char>_> local_228;
  LogMessageFatal local_218 [23];
  Voidify local_201;
  byte *local_200;
  uint local_1f8;
  int local_1f4;
  EpsCopyOutputStream *local_1f0;
  byte *local_1e8;
  uint local_1dc;
  EpsCopyOutputStream *local_1d8;
  uint local_1cc;
  const_pointer local_1c8;
  const_pointer end_4;
  const_pointer it_6;
  EpsCopyOutputStream *local_1b0;
  uint local_1a4;
  RepeatedField<unsigned_int> *local_1a0;
  int local_194;
  EpsCopyOutputStream *local_190;
  EpsCopyOutputStream *local_188;
  uint local_17c;
  byte *local_178;
  uint local_170;
  int local_16c;
  EpsCopyOutputStream *local_168;
  byte local_149;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  LogMessageFatal local_138 [23];
  Voidify local_121;
  byte *local_120;
  uint local_118;
  int local_114;
  EpsCopyOutputStream *local_110;
  byte *local_108;
  uint local_fc;
  EpsCopyOutputStream *local_f8;
  uint local_ec;
  const_pointer local_e8;
  const_pointer end_5;
  const_pointer it_7;
  EpsCopyOutputStream *local_d0;
  uint local_c4;
  RepeatedField<unsigned_long> *local_c0;
  int local_b4;
  EpsCopyOutputStream *local_b0;
  EpsCopyOutputStream *local_a8;
  ulong local_a0;
  byte *local_98;
  uint local_90;
  int local_8c;
  EpsCopyOutputStream *local_88;
  byte local_69;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  LogMessageFatal local_58 [23];
  Voidify local_41;
  byte *local_40;
  uint local_38;
  int local_34;
  EpsCopyOutputStream *local_30;
  byte *local_28;
  uint local_1c;
  EpsCopyOutputStream *local_18;
  uint local_c;
  
  this = Message::GetReflection(message);
  bVar3 = FieldDescriptor::is_extension(field);
  if (bVar3) {
    pDVar12 = FieldDescriptor::containing_type(field);
    pMVar13 = Descriptor::options(pDVar12);
    bVar3 = MessageOptions::message_set_wire_format(pMVar13);
    if (((bVar3) && (CVar4 = FieldDescriptor::cpp_type(field), CVar4 == CPPTYPE_MESSAGE)) &&
       (bVar3 = FieldDescriptor::is_repeated(field), !bVar3)) {
      puVar14 = InternalSerializeMessageSetItem(field,message,target,stream);
      return puVar14;
    }
  }
  bVar3 = FieldDescriptor::is_map(field);
  stream_local = (EpsCopyOutputStream *)target;
  if (bVar3) {
    this_00 = Reflection::GetMapData(this,message,field);
    bVar3 = MapFieldBase::IsMapValid(this_00);
    if (bVar3) {
      bVar3 = io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
      if (bVar3) {
        MapKeySorter::SortKey
                  ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                   &it,message,this,field);
        local_d58._M_current =
             (MapKey *)
             std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::begin
                       ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                         *)&it);
        while( true ) {
          map_value._8_8_ =
               std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::end
                         ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                           *)&it);
          bVar3 = __gnu_cxx::operator!=
                            (&local_d58,
                             (__normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
                              *)&map_value.type_);
          if (!bVar3) break;
          MapValueConstRef::MapValueConstRef((MapValueConstRef *)local_d70);
          pMVar11 = __gnu_cxx::
                    __normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
                    ::operator*(&local_d58);
          Reflection::LookupMapValue(this,message,field,pMVar11,(MapValueConstRef *)local_d70);
          pMVar11 = __gnu_cxx::
                    __normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
                    ::operator*(&local_d58);
          stream_local = (EpsCopyOutputStream *)
                         InternalSerializeMapEntry
                                   (field,pMVar11,(MapValueConstRef *)local_d70,
                                    (uint8_t *)stream_local,stream);
          __gnu_cxx::
          __normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
          ::operator++(&local_d58);
        }
        std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::~vector
                  ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                   &it);
      }
      else {
        Reflection::MapBegin((MapIterator *)local_dd8,this,message,field);
        while( true ) {
          Reflection::MapEnd((MapIterator *)local_e30,this,message,field);
          bVar3 = protobuf::operator!=((MapIterator *)local_dd8,(MapIterator *)local_e30);
          MapIterator::~MapIterator((MapIterator *)local_e30);
          if (!bVar3) break;
          key = MapIterator::GetKey((MapIterator *)local_dd8);
          value_17 = &MapIterator::GetValueRef((MapIterator *)local_dd8)->super_MapValueConstRef;
          stream_local = (EpsCopyOutputStream *)
                         InternalSerializeMapEntry
                                   (field,key,value_17,(uint8_t *)stream_local,stream);
          MapIterator::operator++((MapIterator *)local_dd8);
        }
        MapIterator::~MapIterator((MapIterator *)local_dd8);
      }
      return (uint8_t *)stream_local;
    }
  }
  map_entries.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  bVar3 = FieldDescriptor::is_repeated(field);
  if (bVar3) {
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         Reflection::FieldSize(this,message,field);
  }
  else {
    pDVar12 = FieldDescriptor::containing_type(field);
    pMVar13 = Descriptor::options(pDVar12);
    bVar3 = MessageOptions::map_entry(pMVar13);
    if (bVar3) {
      map_entries.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      bVar3 = Reflection::HasField(this,message,field);
      if (bVar3) {
        map_entries.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      }
    }
  }
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            *)local_e50);
  if (((1 < map_entries.
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) &&
      (bVar3 = FieldDescriptor::is_map(field), bVar3)) &&
     (bVar3 = io::EpsCopyOutputStream::IsSerializationDeterministic(stream), bVar3)) {
    DynamicMapSorter::Sort
              (&local_e68,message,
               map_entries.
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,this,field);
    std::
    vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>::
    operator=((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               *)local_e50,&local_e68);
    std::
    vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>::
    ~vector(&local_e68);
  }
  bVar3 = FieldDescriptor::is_packed(field);
  if (bVar3) {
    field_local = (FieldDescriptor *)target;
    if (map_entries.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
      puVar14 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      TVar5 = FieldDescriptor::type(field);
      switch(TVar5) {
      case TYPE_DOUBLE:
        pRVar26 = Reflection::GetRepeatedFieldInternal<double>(this,message,field);
        RepeatedField<double>::RepeatedField
                  ((RepeatedField<double> *)((long)&r_13.soo_rep_.field_0 + 8),pRVar26);
        iVar6 = FieldDescriptor::number(field);
        pRVar26 = (RepeatedField<double> *)((long)&r_13.soo_rep_.field_0 + 8);
        pbVar24 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        iVar7 = RepeatedField<double>::size(pRVar26);
        uVar8 = iVar7 << 3;
        local_798 = 2;
        local_7c9 = 0;
        local_7f8 = pbVar24;
        local_7f0 = uVar8;
        local_7ec = iVar6;
        local_7e8 = stream;
        local_7a0 = pbVar24;
        local_794 = iVar6;
        local_790 = stream;
        if (stream->end_ <= pbVar24) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_7c8,"ptr < end_");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_7b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                     ,0x355,local_7c8._M_len,local_7c8._M_str);
          local_7c9 = 1;
          pLVar27 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_7b8);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_7a1,pLVar27);
        }
        if ((local_7c9 & 1) != 0) {
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_7b8);
        }
        local_788 = local_7a0;
        for (local_77c = local_794 << 3 | local_798; 0x7f < local_77c; local_77c = local_77c >> 7) {
          *local_788 = (byte)local_77c | 0x80;
          local_788 = local_788 + 1;
        }
        local_7f8 = local_788 + 1;
        *local_788 = (byte)local_77c;
        local_4a8 = local_7f8;
        for (local_49c = local_7f0; 0x7f < local_49c; local_49c = local_49c >> 7) {
          *local_4a8 = (byte)local_49c | 0x80;
          local_4a8 = local_4a8 + 1;
        }
        pbVar24 = local_4a8 + 1;
        *local_4a8 = (byte)local_49c;
        local_788 = local_7f8;
        local_4a8 = pbVar24;
        data_00 = RepeatedField<double>::data(pRVar26);
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::WriteRawLittleEndian<8>
                                 (stream,data_00,uVar8,pbVar24);
        RepeatedField<double>::~RepeatedField
                  ((RepeatedField<double> *)((long)&r_13.soo_rep_.field_0 + 8));
        break;
      case TYPE_FLOAT:
        pRVar25 = Reflection::GetRepeatedFieldInternal<float>(this,message,field);
        RepeatedField<float>::RepeatedField
                  ((RepeatedField<float> *)((long)&r_12.soo_rep_.field_0 + 8),pRVar25);
        iVar6 = FieldDescriptor::number(field);
        pRVar25 = (RepeatedField<float> *)((long)&r_12.soo_rep_.field_0 + 8);
        pbVar24 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        iVar7 = RepeatedField<float>::size(pRVar25);
        uVar8 = iVar7 << 2;
        local_718 = 2;
        local_749 = 0;
        local_778 = pbVar24;
        local_770 = uVar8;
        local_76c = iVar6;
        local_768 = stream;
        local_720 = pbVar24;
        local_714 = iVar6;
        local_710 = stream;
        if (stream->end_ <= pbVar24) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_748,"ptr < end_");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_738,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                     ,0x355,local_748._M_len,local_748._M_str);
          local_749 = 1;
          pLVar27 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_738);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_721,pLVar27);
        }
        if ((local_749 & 1) != 0) {
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_738);
        }
        local_708 = local_720;
        for (local_6fc = local_714 << 3 | local_718; 0x7f < local_6fc; local_6fc = local_6fc >> 7) {
          *local_708 = (byte)local_6fc | 0x80;
          local_708 = local_708 + 1;
        }
        local_778 = local_708 + 1;
        *local_708 = (byte)local_6fc;
        local_4b8 = local_778;
        for (local_4ac = local_770; 0x7f < local_4ac; local_4ac = local_4ac >> 7) {
          *local_4b8 = (byte)local_4ac | 0x80;
          local_4b8 = local_4b8 + 1;
        }
        pbVar24 = local_4b8 + 1;
        *local_4b8 = (byte)local_4ac;
        local_708 = local_778;
        local_4b8 = pbVar24;
        data = RepeatedField<float>::data(pRVar25);
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::WriteRawLittleEndian<4>(stream,data,uVar8,pbVar24);
        RepeatedField<float>::~RepeatedField
                  ((RepeatedField<float> *)((long)&r_12.soo_rep_.field_0 + 8));
        break;
      case TYPE_INT64:
        pRVar17 = Reflection::GetRepeatedFieldInternal<long>(this,message,field);
        RepeatedField<long>::RepeatedField
                  ((RepeatedField<long> *)((long)&r_2.soo_rep_.field_0 + 8),pRVar17);
        iVar6 = FieldDescriptor::number(field);
        sVar18 = FieldDataOnlyByteSize(field,message);
        local_440 = (RepeatedField<long> *)((long)&r_2.soo_rep_.field_0 + 8);
        local_444 = (uint)sVar18;
        it_3 = (const_pointer)io::EpsCopyOutputStream::Encode64;
        local_450 = (EpsCopyOutputStream *)puVar14;
        local_434 = iVar6;
        local_430 = stream;
        local_450 = (EpsCopyOutputStream *)io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        local_40c = local_434;
        local_410 = local_444;
        local_3b4 = local_434;
        local_3b8 = 2;
        local_3e9 = 0;
        local_418 = (byte *)local_450;
        local_408 = stream;
        local_3c0 = (byte *)local_450;
        local_3b0 = stream;
        if (stream->end_ <= local_450) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_3e8,"ptr < end_");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_3d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                     ,0x355,local_3e8._M_len,local_3e8._M_str);
          local_3e9 = 1;
          pLVar27 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_3d8);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_3c1,pLVar27);
        }
        if ((local_3e9 & 1) != 0) {
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_3d8);
        }
        local_3a8 = local_3c0;
        for (local_39c = local_3b4 << 3 | local_3b8; 0x7f < local_39c; local_39c = local_39c >> 7) {
          *local_3a8 = (byte)local_39c | 0x80;
          local_3a8 = local_3a8 + 1;
        }
        local_418 = local_3a8 + 1;
        *local_3a8 = (byte)local_39c;
        local_398 = (EpsCopyOutputStream *)local_418;
        for (local_38c = local_410; 0x7f < local_38c; local_38c = local_38c >> 7) {
          *(byte *)local_398 = (byte)local_38c | 0x80;
          local_398 = (EpsCopyOutputStream *)((long)local_398 + 1);
        }
        local_450 = (EpsCopyOutputStream *)((long)local_398 + 1);
        *(byte *)local_398 = (byte)local_38c;
        local_3a8 = local_418;
        local_398 = local_450;
        plVar19 = RepeatedField<long>::data(local_440);
        end_1 = plVar19;
        iVar6 = RepeatedField<long>::size(local_440);
        local_468 = plVar19 + iVar6;
        do {
          local_450 = (EpsCopyOutputStream *)
                      io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_450);
          lVar1 = *end_1;
          end_1 = end_1 + 1;
          local_420 = (*(code *)it_3)(lVar1);
          local_428 = local_450;
          for (; 0x7f < local_420; local_420 = local_420 >> 7) {
            *(byte *)local_428 = (byte)local_420 | 0x80;
            local_428 = (EpsCopyOutputStream *)((long)local_428 + 1);
          }
          stream_local = (EpsCopyOutputStream *)((long)local_428 + 1);
          *(byte *)local_428 = (byte)local_420;
          local_450 = stream_local;
          local_428 = stream_local;
        } while (end_1 < local_468);
        RepeatedField<long>::~RepeatedField
                  ((RepeatedField<long> *)((long)&r_2.soo_rep_.field_0 + 8));
        break;
      case TYPE_UINT64:
        pRVar22 = Reflection::GetRepeatedFieldInternal<unsigned_long>(this,message,field);
        RepeatedField<unsigned_long>::RepeatedField
                  ((RepeatedField<unsigned_long> *)((long)&r_6.soo_rep_.field_0 + 8),pRVar22);
        iVar6 = FieldDescriptor::number(field);
        sVar18 = FieldDataOnlyByteSize(field,message);
        local_c0 = (RepeatedField<unsigned_long> *)((long)&r_6.soo_rep_.field_0 + 8);
        local_c4 = (uint)sVar18;
        it_7 = (const_pointer)io::EpsCopyOutputStream::Encode64;
        local_d0 = (EpsCopyOutputStream *)puVar14;
        local_b4 = iVar6;
        local_b0 = stream;
        local_d0 = (EpsCopyOutputStream *)io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        local_8c = local_b4;
        local_90 = local_c4;
        local_34 = local_b4;
        local_38 = 2;
        local_69 = 0;
        local_98 = (byte *)local_d0;
        local_88 = stream;
        local_40 = (byte *)local_d0;
        local_30 = stream;
        if (stream->end_ <= local_d0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_68,"ptr < end_");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_58,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                     ,0x355,local_68._M_len,local_68._M_str);
          local_69 = 1;
          pLVar27 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_58);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_41,pLVar27);
        }
        if ((local_69 & 1) != 0) {
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_58);
        }
        local_28 = local_40;
        for (local_1c = local_34 << 3 | local_38; 0x7f < local_1c; local_1c = local_1c >> 7) {
          *local_28 = (byte)local_1c | 0x80;
          local_28 = local_28 + 1;
        }
        local_98 = local_28 + 1;
        *local_28 = (byte)local_1c;
        local_18 = (EpsCopyOutputStream *)local_98;
        for (local_c = local_90; 0x7f < local_c; local_c = local_c >> 7) {
          *(byte *)local_18 = (byte)local_c | 0x80;
          local_18 = (EpsCopyOutputStream *)((long)local_18 + 1);
        }
        local_d0 = (EpsCopyOutputStream *)((long)local_18 + 1);
        *(byte *)local_18 = (byte)local_c;
        local_28 = local_98;
        local_18 = local_d0;
        puVar23 = RepeatedField<unsigned_long>::data(local_c0);
        end_5 = puVar23;
        iVar6 = RepeatedField<unsigned_long>::size(local_c0);
        local_e8 = puVar23 + iVar6;
        do {
          local_d0 = (EpsCopyOutputStream *)
                     io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_d0);
          uVar2 = *end_5;
          end_5 = end_5 + 1;
          local_a0 = (*(code *)it_7)(uVar2);
          local_a8 = local_d0;
          for (; 0x7f < local_a0; local_a0 = local_a0 >> 7) {
            *(byte *)local_a8 = (byte)local_a0 | 0x80;
            local_a8 = (EpsCopyOutputStream *)((long)local_a8 + 1);
          }
          stream_local = (EpsCopyOutputStream *)((long)local_a8 + 1);
          *(byte *)local_a8 = (byte)local_a0;
          local_d0 = stream_local;
          local_a8 = stream_local;
        } while (end_5 < local_e8);
        RepeatedField<unsigned_long>::~RepeatedField
                  ((RepeatedField<unsigned_long> *)((long)&r_6.soo_rep_.field_0 + 8));
        break;
      case TYPE_INT32:
        pRVar15 = Reflection::GetRepeatedFieldInternal<int>(this,message,field);
        RepeatedField<int>::RepeatedField
                  ((RepeatedField<int> *)((long)&r_1.soo_rep_.field_0 + 8),pRVar15);
        iVar6 = FieldDescriptor::number(field);
        sVar18 = FieldDataOnlyByteSize(field,message);
        pRVar15 = (RepeatedField<int> *)((long)&r_1.soo_rep_.field_0 + 8);
        local_920 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        local_918 = 2;
        local_914 = iVar6;
        local_910 = stream;
        if (stream->end_ <= local_920) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_948,"ptr < end_");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_938,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                     ,0x355,local_948._M_len,local_948._M_str);
          pLVar27 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_938);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_921,pLVar27);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_938);
        }
        local_908 = local_920;
        for (local_8fc = iVar6 << 3 | 2; 0x7f < local_8fc; local_8fc = local_8fc >> 7) {
          *local_908 = (byte)local_8fc | 0x80;
          local_908 = local_908 + 1;
        }
        *local_908 = (byte)local_8fc;
        local_478 = (EpsCopyOutputStream *)(local_908 + 1);
        for (local_46c = (uint)sVar18; 0x7f < local_46c; local_46c = local_46c >> 7) {
          *(byte *)local_478 = (byte)local_46c | 0x80;
          local_478 = (EpsCopyOutputStream *)((long)local_478 + 1);
        }
        local_9b0 = (EpsCopyOutputStream *)((long)local_478 + 1);
        *(byte *)local_478 = (byte)local_46c;
        local_908 = local_908 + 1;
        local_478 = local_9b0;
        piVar16 = RepeatedField<int>::data(pRVar15);
        iVar6 = RepeatedField<int>::size(pRVar15);
        end = piVar16;
        do {
          local_988 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_9b0);
          piVar32 = end + 1;
          for (local_980 = io::EpsCopyOutputStream::Encode64((long)*end); 0x7f < local_980;
              local_980 = local_980 >> 7) {
            *local_988 = (byte)local_980 | 0x80;
            local_988 = local_988 + 1;
          }
          stream_local = (EpsCopyOutputStream *)(local_988 + 1);
          *local_988 = (byte)local_980;
          end = piVar32;
          local_9b0 = stream_local;
        } while (piVar32 < piVar16 + iVar6);
        RepeatedField<int>::~RepeatedField((RepeatedField<int> *)((long)&r_1.soo_rep_.field_0 + 8));
        break;
      case TYPE_FIXED64:
        pRVar22 = Reflection::GetRepeatedFieldInternal<unsigned_long>(this,message,field);
        RepeatedField<unsigned_long>::RepeatedField
                  ((RepeatedField<unsigned_long> *)((long)&r_9.soo_rep_.field_0 + 8),pRVar22);
        iVar6 = FieldDescriptor::number(field);
        pRVar22 = (RepeatedField<unsigned_long> *)((long)&r_9.soo_rep_.field_0 + 8);
        pbVar24 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        iVar7 = RepeatedField<unsigned_long>::size(pRVar22);
        uVar8 = iVar7 << 3;
        local_598 = 2;
        local_5c9 = 0;
        local_5f8 = pbVar24;
        local_5f0 = uVar8;
        local_5ec = iVar6;
        local_5e8 = stream;
        local_5a0 = pbVar24;
        local_594 = iVar6;
        local_590 = stream;
        if (stream->end_ <= pbVar24) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_5c8,"ptr < end_");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_5b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                     ,0x355,local_5c8._M_len,local_5c8._M_str);
          local_5c9 = 1;
          pLVar27 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_5b8);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_5a1,pLVar27);
        }
        if ((local_5c9 & 1) != 0) {
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_5b8);
        }
        local_588 = local_5a0;
        for (local_57c = local_594 << 3 | local_598; 0x7f < local_57c; local_57c = local_57c >> 7) {
          *local_588 = (byte)local_57c | 0x80;
          local_588 = local_588 + 1;
        }
        local_5f8 = local_588 + 1;
        *local_588 = (byte)local_57c;
        local_4e8 = local_5f8;
        for (local_4dc = local_5f0; 0x7f < local_4dc; local_4dc = local_4dc >> 7) {
          *local_4e8 = (byte)local_4dc | 0x80;
          local_4e8 = local_4e8 + 1;
        }
        pbVar24 = local_4e8 + 1;
        *local_4e8 = (byte)local_4dc;
        local_588 = local_5f8;
        local_4e8 = pbVar24;
        puVar23 = RepeatedField<unsigned_long>::data(pRVar22);
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::WriteRawLittleEndian<8>
                                 (stream,puVar23,uVar8,pbVar24);
        RepeatedField<unsigned_long>::~RepeatedField
                  ((RepeatedField<unsigned_long> *)((long)&r_9.soo_rep_.field_0 + 8));
        break;
      case TYPE_FIXED32:
        pRVar20 = Reflection::GetRepeatedFieldInternal<unsigned_int>(this,message,field);
        RepeatedField<unsigned_int>::RepeatedField
                  ((RepeatedField<unsigned_int> *)((long)&r_8.soo_rep_.field_0 + 8),pRVar20);
        iVar6 = FieldDescriptor::number(field);
        pRVar20 = (RepeatedField<unsigned_int> *)((long)&r_8.soo_rep_.field_0 + 8);
        pbVar24 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        iVar7 = RepeatedField<unsigned_int>::size(pRVar20);
        uVar8 = iVar7 << 2;
        local_518 = 2;
        local_549 = 0;
        local_578 = pbVar24;
        local_570 = uVar8;
        local_56c = iVar6;
        local_568 = stream;
        local_520 = pbVar24;
        local_514 = iVar6;
        local_510 = stream;
        if (stream->end_ <= pbVar24) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_548,"ptr < end_");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_538,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                     ,0x355,local_548._M_len,local_548._M_str);
          local_549 = 1;
          pLVar27 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_538);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_521,pLVar27);
        }
        if ((local_549 & 1) != 0) {
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_538);
        }
        local_508 = local_520;
        for (local_4fc = local_514 << 3 | local_518; 0x7f < local_4fc; local_4fc = local_4fc >> 7) {
          *local_508 = (byte)local_4fc | 0x80;
          local_508 = local_508 + 1;
        }
        local_578 = local_508 + 1;
        *local_508 = (byte)local_4fc;
        local_4f8 = local_578;
        for (local_4ec = local_570; 0x7f < local_4ec; local_4ec = local_4ec >> 7) {
          *local_4f8 = (byte)local_4ec | 0x80;
          local_4f8 = local_4f8 + 1;
        }
        pbVar24 = local_4f8 + 1;
        *local_4f8 = (byte)local_4ec;
        local_508 = local_578;
        local_4f8 = pbVar24;
        puVar21 = RepeatedField<unsigned_int>::data(pRVar20);
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::WriteRawLittleEndian<4>
                                 (stream,puVar21,uVar8,pbVar24);
        RepeatedField<unsigned_int>::~RepeatedField
                  ((RepeatedField<unsigned_int> *)((long)&r_8.soo_rep_.field_0 + 8));
        break;
      case TYPE_BOOL:
        rhs = Reflection::GetRepeatedFieldInternal<bool>(this,message,field);
        RepeatedField<bool>::RepeatedField((RepeatedField<bool> *)local_f50,rhs);
        iVar6 = FieldDescriptor::number(field);
        pbVar24 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        uVar8 = RepeatedField<bool>::size((RepeatedField<bool> *)local_f50);
        local_818 = 2;
        local_849 = 0;
        local_878 = pbVar24;
        local_870 = uVar8;
        local_86c = iVar6;
        local_868 = stream;
        local_820 = pbVar24;
        local_814 = iVar6;
        local_810 = stream;
        if (stream->end_ <= pbVar24) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_848,"ptr < end_");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_838,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                     ,0x355,local_848._M_len,local_848._M_str);
          local_849 = 1;
          pLVar27 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_838);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_821,pLVar27);
        }
        if ((local_849 & 1) != 0) {
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_838);
        }
        local_808 = local_820;
        for (local_7fc = local_814 << 3 | local_818; 0x7f < local_7fc; local_7fc = local_7fc >> 7) {
          *local_808 = (byte)local_7fc | 0x80;
          local_808 = local_808 + 1;
        }
        local_878 = local_808 + 1;
        *local_808 = (byte)local_7fc;
        local_498 = local_878;
        for (local_48c = local_870; 0x7f < local_48c; local_48c = local_48c >> 7) {
          *local_498 = (byte)local_48c | 0x80;
          local_498 = local_498 + 1;
        }
        pbVar24 = local_498 + 1;
        *local_498 = (byte)local_48c;
        local_808 = local_878;
        local_498 = pbVar24;
        data_01 = RepeatedField<bool>::data((RepeatedField<bool> *)local_f50);
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::WriteRawLittleEndian<1>
                                 (stream,data_01,uVar8,pbVar24);
        RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)local_f50);
        break;
      default:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&get_message_from_field.message_reflection,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/wire_format.cc"
                   ,0x539);
        pLVar27 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                            ((LogMessage *)&get_message_from_field.message_reflection);
        pLVar27 = absl::lts_20240722::log_internal::LogMessage::operator<<
                            (pLVar27,(char (*) [19])"Invalid descriptor");
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_f51,pLVar27);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&get_message_from_field.message_reflection);
      case TYPE_UINT32:
        pRVar20 = Reflection::GetRepeatedFieldInternal<unsigned_int>(this,message,field);
        RepeatedField<unsigned_int>::RepeatedField
                  ((RepeatedField<unsigned_int> *)((long)&r_5.soo_rep_.field_0 + 8),pRVar20);
        iVar6 = FieldDescriptor::number(field);
        sVar18 = FieldDataOnlyByteSize(field,message);
        local_1a0 = (RepeatedField<unsigned_int> *)((long)&r_5.soo_rep_.field_0 + 8);
        local_1a4 = (uint)sVar18;
        it_6 = (const_pointer)io::EpsCopyOutputStream::Encode32;
        local_1b0 = (EpsCopyOutputStream *)puVar14;
        local_194 = iVar6;
        local_190 = stream;
        local_1b0 = (EpsCopyOutputStream *)io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        local_16c = local_194;
        local_170 = local_1a4;
        local_114 = local_194;
        local_118 = 2;
        local_149 = 0;
        local_178 = (byte *)local_1b0;
        local_168 = stream;
        local_120 = (byte *)local_1b0;
        local_110 = stream;
        if (stream->end_ <= local_1b0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_148,"ptr < end_");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_138,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                     ,0x355,local_148._M_len,local_148._M_str);
          local_149 = 1;
          pLVar27 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_138);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_121,pLVar27);
        }
        if ((local_149 & 1) != 0) {
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_138);
        }
        local_108 = local_120;
        for (local_fc = local_114 << 3 | local_118; 0x7f < local_fc; local_fc = local_fc >> 7) {
          *local_108 = (byte)local_fc | 0x80;
          local_108 = local_108 + 1;
        }
        local_178 = local_108 + 1;
        *local_108 = (byte)local_fc;
        local_f8 = (EpsCopyOutputStream *)local_178;
        for (local_ec = local_170; 0x7f < local_ec; local_ec = local_ec >> 7) {
          *(byte *)local_f8 = (byte)local_ec | 0x80;
          local_f8 = (EpsCopyOutputStream *)((long)local_f8 + 1);
        }
        local_1b0 = (EpsCopyOutputStream *)((long)local_f8 + 1);
        *(byte *)local_f8 = (byte)local_ec;
        local_108 = local_178;
        local_f8 = local_1b0;
        puVar21 = RepeatedField<unsigned_int>::data(local_1a0);
        end_4 = puVar21;
        iVar6 = RepeatedField<unsigned_int>::size(local_1a0);
        local_1c8 = puVar21 + iVar6;
        do {
          local_1b0 = (EpsCopyOutputStream *)
                      io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_1b0);
          uVar8 = *end_4;
          end_4 = end_4 + 1;
          local_17c = (*(code *)it_6)(uVar8);
          local_188 = local_1b0;
          for (; 0x7f < local_17c; local_17c = local_17c >> 7) {
            *(byte *)local_188 = (byte)local_17c | 0x80;
            local_188 = (EpsCopyOutputStream *)((long)local_188 + 1);
          }
          stream_local = (EpsCopyOutputStream *)((long)local_188 + 1);
          *(byte *)local_188 = (byte)local_17c;
          local_1b0 = stream_local;
          local_188 = stream_local;
        } while (end_4 < local_1c8);
        RepeatedField<unsigned_int>::~RepeatedField
                  ((RepeatedField<unsigned_int> *)((long)&r_5.soo_rep_.field_0 + 8));
        break;
      case TYPE_ENUM:
        pRVar15 = Reflection::GetRepeatedFieldInternal<int>(this,message,field);
        RepeatedField<int>::RepeatedField
                  ((RepeatedField<int> *)((long)&r_7.soo_rep_.field_0 + 8),pRVar15);
        iVar6 = FieldDescriptor::number(field);
        sVar18 = FieldDataOnlyByteSize(field,message);
        pRVar15 = (RepeatedField<int> *)((long)&r_7.soo_rep_.field_0 + 8);
        local_8f8 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        local_898 = 2;
        local_8c9 = 0;
        local_8f0 = (uint)sVar18;
        local_8ec = iVar6;
        local_8e8 = stream;
        local_8a0 = local_8f8;
        local_894 = iVar6;
        local_890 = stream;
        if (stream->end_ <= local_8f8) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_8c8,"ptr < end_");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_8b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                     ,0x355,local_8c8._M_len,local_8c8._M_str);
          local_8c9 = 1;
          pLVar27 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_8b8);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_8a1,pLVar27);
        }
        if ((local_8c9 & 1) != 0) {
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_8b8);
        }
        local_888 = local_8a0;
        for (local_87c = local_894 << 3 | local_898; 0x7f < local_87c; local_87c = local_87c >> 7) {
          *local_888 = (byte)local_87c | 0x80;
          local_888 = local_888 + 1;
        }
        local_8f8 = local_888 + 1;
        *local_888 = (byte)local_87c;
        local_488 = (EpsCopyOutputStream *)local_8f8;
        for (local_47c = local_8f0; 0x7f < local_47c; local_47c = local_47c >> 7) {
          *(byte *)local_488 = (byte)local_47c | 0x80;
          local_488 = (EpsCopyOutputStream *)((long)local_488 + 1);
        }
        local_a00 = (EpsCopyOutputStream *)((long)local_488 + 1);
        *(byte *)local_488 = (byte)local_47c;
        local_888 = local_8f8;
        local_488 = local_a00;
        piVar16 = RepeatedField<int>::data(pRVar15);
        iVar6 = RepeatedField<int>::size(pRVar15);
        end_6 = piVar16;
        do {
          local_9d8 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_a00);
          piVar32 = end_6 + 1;
          for (local_9d0 = io::EpsCopyOutputStream::Encode64((long)*end_6); 0x7f < local_9d0;
              local_9d0 = local_9d0 >> 7) {
            *local_9d8 = (byte)local_9d0 | 0x80;
            local_9d8 = local_9d8 + 1;
          }
          stream_local = (EpsCopyOutputStream *)(local_9d8 + 1);
          *local_9d8 = (byte)local_9d0;
          end_6 = piVar32;
          local_a00 = stream_local;
        } while (piVar32 < piVar16 + iVar6);
        RepeatedField<int>::~RepeatedField((RepeatedField<int> *)((long)&r_7.soo_rep_.field_0 + 8));
        break;
      case TYPE_SFIXED32:
        pRVar15 = Reflection::GetRepeatedFieldInternal<int>(this,message,field);
        RepeatedField<int>::RepeatedField
                  ((RepeatedField<int> *)((long)&r_10.soo_rep_.field_0 + 8),pRVar15);
        iVar6 = FieldDescriptor::number(field);
        pRVar15 = (RepeatedField<int> *)((long)&r_10.soo_rep_.field_0 + 8);
        pbVar24 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        iVar7 = RepeatedField<int>::size(pRVar15);
        uVar8 = iVar7 << 2;
        local_618 = 2;
        local_649 = 0;
        local_678 = pbVar24;
        local_670 = uVar8;
        local_66c = iVar6;
        local_668 = stream;
        local_620 = pbVar24;
        local_614 = iVar6;
        local_610 = stream;
        if (stream->end_ <= pbVar24) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_648,"ptr < end_");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_638,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                     ,0x355,local_648._M_len,local_648._M_str);
          local_649 = 1;
          pLVar27 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_638);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_621,pLVar27);
        }
        if ((local_649 & 1) != 0) {
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_638);
        }
        local_608 = local_620;
        for (local_5fc = local_614 << 3 | local_618; 0x7f < local_5fc; local_5fc = local_5fc >> 7) {
          *local_608 = (byte)local_5fc | 0x80;
          local_608 = local_608 + 1;
        }
        local_678 = local_608 + 1;
        *local_608 = (byte)local_5fc;
        local_4d8 = local_678;
        for (local_4cc = local_670; 0x7f < local_4cc; local_4cc = local_4cc >> 7) {
          *local_4d8 = (byte)local_4cc | 0x80;
          local_4d8 = local_4d8 + 1;
        }
        pbVar24 = local_4d8 + 1;
        *local_4d8 = (byte)local_4cc;
        local_608 = local_678;
        local_4d8 = pbVar24;
        piVar16 = RepeatedField<int>::data(pRVar15);
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::WriteRawLittleEndian<4>
                                 (stream,piVar16,uVar8,pbVar24);
        RepeatedField<int>::~RepeatedField((RepeatedField<int> *)((long)&r_10.soo_rep_.field_0 + 8))
        ;
        break;
      case TYPE_SFIXED64:
        pRVar17 = Reflection::GetRepeatedFieldInternal<long>(this,message,field);
        RepeatedField<long>::RepeatedField
                  ((RepeatedField<long> *)((long)&r_11.soo_rep_.field_0 + 8),pRVar17);
        iVar6 = FieldDescriptor::number(field);
        pRVar17 = (RepeatedField<long> *)((long)&r_11.soo_rep_.field_0 + 8);
        pbVar24 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        iVar7 = RepeatedField<long>::size(pRVar17);
        uVar8 = iVar7 << 3;
        local_698 = 2;
        local_6c9 = 0;
        local_6f8 = pbVar24;
        local_6f0 = uVar8;
        local_6ec = iVar6;
        local_6e8 = stream;
        local_6a0 = pbVar24;
        local_694 = iVar6;
        local_690 = stream;
        if (stream->end_ <= pbVar24) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_6c8,"ptr < end_");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_6b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                     ,0x355,local_6c8._M_len,local_6c8._M_str);
          local_6c9 = 1;
          pLVar27 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_6b8);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_6a1,pLVar27);
        }
        if ((local_6c9 & 1) != 0) {
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_6b8);
        }
        local_688 = local_6a0;
        for (local_67c = local_694 << 3 | local_698; 0x7f < local_67c; local_67c = local_67c >> 7) {
          *local_688 = (byte)local_67c | 0x80;
          local_688 = local_688 + 1;
        }
        local_6f8 = local_688 + 1;
        *local_688 = (byte)local_67c;
        local_4c8 = local_6f8;
        for (local_4bc = local_6f0; 0x7f < local_4bc; local_4bc = local_4bc >> 7) {
          *local_4c8 = (byte)local_4bc | 0x80;
          local_4c8 = local_4c8 + 1;
        }
        pbVar24 = local_4c8 + 1;
        *local_4c8 = (byte)local_4bc;
        local_688 = local_6f8;
        local_4c8 = pbVar24;
        plVar19 = RepeatedField<long>::data(pRVar17);
        stream_local = (EpsCopyOutputStream *)
                       io::EpsCopyOutputStream::WriteRawLittleEndian<8>
                                 (stream,plVar19,uVar8,pbVar24);
        RepeatedField<long>::~RepeatedField
                  ((RepeatedField<long> *)((long)&r_11.soo_rep_.field_0 + 8));
        break;
      case TYPE_SINT32:
        pRVar15 = Reflection::GetRepeatedFieldInternal<int>(this,message,field);
        RepeatedField<int>::RepeatedField
                  ((RepeatedField<int> *)((long)&r_3.soo_rep_.field_0 + 8),pRVar15);
        iVar6 = FieldDescriptor::number(field);
        sVar18 = FieldDataOnlyByteSize(field,message);
        local_360 = (RepeatedField<int> *)((long)&r_3.soo_rep_.field_0 + 8);
        local_364 = (uint)sVar18;
        it_4 = (const_pointer)io::EpsCopyOutputStream::ZigZagEncode32;
        local_370 = (EpsCopyOutputStream *)puVar14;
        local_354 = iVar6;
        local_350 = stream;
        local_370 = (EpsCopyOutputStream *)io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        local_32c = local_354;
        local_330 = local_364;
        local_2d4 = local_354;
        local_2d8 = 2;
        local_309 = 0;
        local_338 = (byte *)local_370;
        local_328 = stream;
        local_2e0 = (byte *)local_370;
        local_2d0 = stream;
        if (stream->end_ <= local_370) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_308,"ptr < end_");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_2f8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                     ,0x355,local_308._M_len,local_308._M_str);
          local_309 = 1;
          pLVar27 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_2f8);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_2e1,pLVar27);
        }
        if ((local_309 & 1) != 0) {
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_2f8);
        }
        local_2c8 = local_2e0;
        for (local_2bc = local_2d4 << 3 | local_2d8; 0x7f < local_2bc; local_2bc = local_2bc >> 7) {
          *local_2c8 = (byte)local_2bc | 0x80;
          local_2c8 = local_2c8 + 1;
        }
        local_338 = local_2c8 + 1;
        *local_2c8 = (byte)local_2bc;
        local_2b8 = (EpsCopyOutputStream *)local_338;
        for (local_2ac = local_330; 0x7f < local_2ac; local_2ac = local_2ac >> 7) {
          *(byte *)local_2b8 = (byte)local_2ac | 0x80;
          local_2b8 = (EpsCopyOutputStream *)((long)local_2b8 + 1);
        }
        local_370 = (EpsCopyOutputStream *)((long)local_2b8 + 1);
        *(byte *)local_2b8 = (byte)local_2ac;
        local_2c8 = local_338;
        local_2b8 = local_370;
        piVar16 = RepeatedField<int>::data(local_360);
        end_2 = piVar16;
        iVar6 = RepeatedField<int>::size(local_360);
        local_388 = piVar16 + iVar6;
        do {
          local_370 = (EpsCopyOutputStream *)
                      io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_370);
          iVar6 = *end_2;
          end_2 = end_2 + 1;
          local_33c = (*(code *)it_4)(iVar6);
          local_348 = local_370;
          for (; 0x7f < local_33c; local_33c = local_33c >> 7) {
            *(byte *)local_348 = (byte)local_33c | 0x80;
            local_348 = (EpsCopyOutputStream *)((long)local_348 + 1);
          }
          stream_local = (EpsCopyOutputStream *)((long)local_348 + 1);
          *(byte *)local_348 = (byte)local_33c;
          local_370 = stream_local;
          local_348 = stream_local;
        } while (end_2 < local_388);
        RepeatedField<int>::~RepeatedField((RepeatedField<int> *)((long)&r_3.soo_rep_.field_0 + 8));
        break;
      case MAX_TYPE:
        pRVar17 = Reflection::GetRepeatedFieldInternal<long>(this,message,field);
        RepeatedField<long>::RepeatedField
                  ((RepeatedField<long> *)((long)&r_4.soo_rep_.field_0 + 8),pRVar17);
        iVar6 = FieldDescriptor::number(field);
        sVar18 = FieldDataOnlyByteSize(field,message);
        local_280 = (RepeatedField<long> *)((long)&r_4.soo_rep_.field_0 + 8);
        local_284 = (uint)sVar18;
        it_5 = (const_pointer)io::EpsCopyOutputStream::ZigZagEncode64;
        local_290 = (EpsCopyOutputStream *)puVar14;
        local_274 = iVar6;
        local_270 = stream;
        local_290 = (EpsCopyOutputStream *)io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        local_24c = local_274;
        local_250 = local_284;
        local_1f4 = local_274;
        local_1f8 = 2;
        local_229 = 0;
        local_258 = (byte *)local_290;
        local_248 = stream;
        local_200 = (byte *)local_290;
        local_1f0 = stream;
        if (stream->end_ <= local_290) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_228,"ptr < end_");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_218,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                     ,0x355,local_228._M_len,local_228._M_str);
          local_229 = 1;
          pLVar27 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_218);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_201,pLVar27);
        }
        if ((local_229 & 1) != 0) {
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_218);
        }
        local_1e8 = local_200;
        for (local_1dc = local_1f4 << 3 | local_1f8; 0x7f < local_1dc; local_1dc = local_1dc >> 7) {
          *local_1e8 = (byte)local_1dc | 0x80;
          local_1e8 = local_1e8 + 1;
        }
        local_258 = local_1e8 + 1;
        *local_1e8 = (byte)local_1dc;
        local_1d8 = (EpsCopyOutputStream *)local_258;
        for (local_1cc = local_250; 0x7f < local_1cc; local_1cc = local_1cc >> 7) {
          *(byte *)local_1d8 = (byte)local_1cc | 0x80;
          local_1d8 = (EpsCopyOutputStream *)((long)local_1d8 + 1);
        }
        local_290 = (EpsCopyOutputStream *)((long)local_1d8 + 1);
        *(byte *)local_1d8 = (byte)local_1cc;
        local_1e8 = local_258;
        local_1d8 = local_290;
        plVar19 = RepeatedField<long>::data(local_280);
        end_3 = plVar19;
        iVar6 = RepeatedField<long>::size(local_280);
        local_2a8 = plVar19 + iVar6;
        do {
          local_290 = (EpsCopyOutputStream *)
                      io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_290);
          lVar1 = *end_3;
          end_3 = end_3 + 1;
          local_260 = (*(code *)it_5)(lVar1);
          local_268 = local_290;
          for (; 0x7f < local_260; local_260 = local_260 >> 7) {
            *(byte *)local_268 = (byte)local_260 | 0x80;
            local_268 = (EpsCopyOutputStream *)((long)local_268 + 1);
          }
          stream_local = (EpsCopyOutputStream *)((long)local_268 + 1);
          *(byte *)local_268 = (byte)local_260;
          local_290 = stream_local;
          local_268 = stream_local;
        } while (end_3 < local_2a8);
        RepeatedField<long>::~RepeatedField
                  ((RepeatedField<long> *)((long)&r_4.soo_rep_.field_0 + 8));
      }
      field_local = (FieldDescriptor *)stream_local;
    }
  }
  else {
    get_message_from_field.message = (Message *)local_e50;
    _value = message;
    get_message_from_field.map_entries =
         (vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          *)this;
    for (value_1._4_4_ = 0;
        value_1._4_4_ <
        map_entries.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; value_1._4_4_ = value_1._4_4_ + 1)
    {
      stream_local = (EpsCopyOutputStream *)
                     io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
      TVar5 = FieldDescriptor::type(field);
      switch(TVar5) {
      case TYPE_DOUBLE:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_1838 = Reflection::GetRepeatedDouble(this,message,field,value_1._4_4_);
        }
        else {
          local_1838 = Reflection::GetDouble(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteDoubleToArray(iVar6,local_1838,(uint8_t *)stream_local);
        break;
      case TYPE_FLOAT:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_180c = Reflection::GetRepeatedFloat(this,message,field,value_1._4_4_);
        }
        else {
          local_180c = Reflection::GetFloat(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteFloatToArray(iVar6,local_180c,(uint8_t *)stream_local);
        break;
      case TYPE_INT64:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_16a8 = Reflection::GetRepeatedInt64(this,message,field,value_1._4_4_);
        }
        else {
          local_16a8 = Reflection::GetInt64(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteInt64ToArray(iVar6,local_16a8,(uint8_t *)stream_local);
        break;
      case TYPE_UINT64:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_1748 = Reflection::GetRepeatedUInt64(this,message,field,value_1._4_4_);
        }
        else {
          local_1748 = Reflection::GetUInt64(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteUInt64ToArray(iVar6,local_1748,(uint8_t *)stream_local);
        break;
      case TYPE_INT32:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_167c = Reflection::GetRepeatedInt32(this,message,field,value_1._4_4_);
        }
        else {
          local_167c = Reflection::GetInt32(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteInt32ToArray(iVar6,local_167c,(uint8_t *)stream_local);
        break;
      case TYPE_FIXED64:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_1798 = Reflection::GetRepeatedUInt64(this,message,field,value_1._4_4_);
        }
        else {
          local_1798 = Reflection::GetUInt64(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteFixed64ToArray(iVar6,local_1798,(uint8_t *)stream_local)
        ;
        break;
      case TYPE_FIXED32:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_176c = Reflection::GetRepeatedUInt32(this,message,field,value_1._4_4_);
        }
        else {
          local_176c = Reflection::GetUInt32(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteFixed32ToArray(iVar6,local_176c,(uint8_t *)stream_local)
        ;
        break;
      case TYPE_BOOL:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_1853 = Reflection::GetRepeatedBool(this,message,field,value_1._4_4_);
        }
        else {
          local_1853 = Reflection::GetBool(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteBoolToArray(iVar6,local_1853,(uint8_t *)stream_local);
        break;
      case TYPE_STRING:
        scratch.field_2._M_local_buf[0xf] = FieldDescriptor::requires_utf8_validation(field);
        std::__cxx11::string::string((string *)&value_14);
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_18e0 = Reflection::GetRepeatedStringReference
                                 (this,message,field,value_1._4_4_,(string *)&value_14);
        }
        else {
          local_18e0 = Reflection::GetStringReference(this,message,field,(string *)&value_14);
        }
        if ((scratch.field_2._M_local_buf[0xf] & 1U) == 0) {
          data_02 = (char *)std::__cxx11::string::data();
          iVar6 = std::__cxx11::string::length();
          psVar29 = FieldDescriptor::full_name_abi_cxx11_(field);
          sVar33 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar29);
          VerifyUTF8StringNamedField(data_02,iVar6,SERIALIZE,sVar33);
        }
        else {
          this_01 = (WireFormatLite *)std::__cxx11::string::data();
          uVar8 = std::__cxx11::string::length();
          psVar29 = FieldDescriptor::full_name_abi_cxx11_(field);
          op = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar29);
          sVar33._M_str = in_R9;
          sVar33._M_len = extraout_RDX;
          WireFormatLite::VerifyUtf8String(this_01,(char *)(ulong)uVar8,1,op,sVar33);
        }
        uVar10 = FieldDescriptor::number(field);
        sVar30 = std::__cxx11::string::size();
        bVar3 = true;
        if ((long)sVar30 < 0x80) {
          puVar14 = stream->end_;
          iVar6 = io::EpsCopyOutputStream::TagSize(uVar10 << 3);
          bVar3 = (long)(puVar14 + (-(long)iVar6 - (long)stream_local) + 0xf) < (long)sVar30;
        }
        if (bVar3) {
          local_ca8 = (EpsCopyOutputStream *)
                      io::EpsCopyOutputStream::WriteStringOutline
                                (stream,uVar10,local_18e0,(uint8_t *)stream_local);
        }
        else {
          local_a38 = stream_local;
          for (local_a2c = uVar10 << 3 | 2; 0x7f < local_a2c; local_a2c = local_a2c >> 7) {
            *(byte *)&local_a38->end_ = (byte)local_a2c | 0x80;
            local_a38 = (EpsCopyOutputStream *)((long)&local_a38->end_ + 1);
          }
          *(byte *)&local_a38->end_ = (byte)local_a2c;
          puVar14 = (uint8_t *)((long)&local_a38->end_ + 2);
          *(uint8_t *)((long)&local_a38->end_ + 1) = (uint8_t)sVar30;
          pvVar31 = (void *)std::__cxx11::string::data();
          memcpy(puVar14,pvVar31,sVar30);
          local_ca8 = (EpsCopyOutputStream *)(puVar14 + sVar30);
        }
        stream_local = local_ca8;
        std::__cxx11::string::~string((string *)&value_14);
        break;
      case TYPE_GROUP:
        pMVar28 = &InternalSerializeField::anon_class_24_3_10f69874::operator()
                             ((anon_class_24_3_10f69874 *)&value,field,value_1._4_4_)->
                   super_MessageLite;
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::InternalWriteGroup
                                 (iVar6,pMVar28,(uint8_t *)stream_local,stream);
        break;
      case TYPE_MESSAGE:
        pMVar28 = &InternalSerializeField::anon_class_24_3_10f69874::operator()
                             ((anon_class_24_3_10f69874 *)&value,field,value_1._4_4_)->
                   super_MessageLite;
        iVar6 = FieldDescriptor::number(field);
        iVar7 = MessageLite::GetCachedSize(pMVar28);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::InternalWriteMessage
                                 (iVar6,pMVar28,iVar7,(uint8_t *)stream_local,stream);
        break;
      case TYPE_BYTES:
        CVar9 = FieldDescriptor::cpp_string_type(field);
        if (CVar9 == kCord) {
          Reflection::GetCord((Reflection *)((long)&scratch_1.field_2 + 8),(Message *)this,
                              (FieldDescriptor *)message);
          uVar10 = FieldDescriptor::number(field);
          stream_local = (EpsCopyOutputStream *)
                         io::EpsCopyOutputStream::WriteString
                                   (stream,uVar10,(Cord *)((long)&scratch_1.field_2 + 8),
                                    (uint8_t *)stream_local);
          absl::lts_20240722::Cord::~Cord((Cord *)((long)&scratch_1.field_2 + 8));
        }
        else {
          std::__cxx11::string::string((string *)&value_15);
          bVar3 = FieldDescriptor::is_repeated(field);
          if (bVar3) {
            local_1988 = Reflection::GetRepeatedStringReference
                                   (this,message,field,value_1._4_4_,(string *)&value_15);
          }
          else {
            local_1988 = Reflection::GetStringReference(this,message,field,(string *)&value_15);
          }
          uVar10 = FieldDescriptor::number(field);
          sVar30 = std::__cxx11::string::size();
          bVar3 = true;
          if ((long)sVar30 < 0x80) {
            puVar14 = stream->end_;
            iVar6 = io::EpsCopyOutputStream::TagSize(uVar10 << 3);
            bVar3 = (long)(puVar14 + (-(long)iVar6 - (long)stream_local) + 0xf) < (long)sVar30;
          }
          if (bVar3) {
            local_cd8 = (EpsCopyOutputStream *)
                        io::EpsCopyOutputStream::WriteStringOutline
                                  (stream,uVar10,local_1988,(uint8_t *)stream_local);
          }
          else {
            local_a28 = stream_local;
            for (local_a1c = uVar10 << 3 | 2; 0x7f < local_a1c; local_a1c = local_a1c >> 7) {
              *(byte *)&local_a28->end_ = (byte)local_a1c | 0x80;
              local_a28 = (EpsCopyOutputStream *)((long)&local_a28->end_ + 1);
            }
            *(byte *)&local_a28->end_ = (byte)local_a1c;
            puVar14 = (uint8_t *)((long)&local_a28->end_ + 2);
            *(uint8_t *)((long)&local_a28->end_ + 1) = (uint8_t)sVar30;
            pvVar31 = (void *)std::__cxx11::string::data();
            memcpy(puVar14,pvVar31,sVar30);
            local_cd8 = (EpsCopyOutputStream *)(puVar14 + sVar30);
          }
          stream_local = local_cd8;
          std::__cxx11::string::~string((string *)&value_15);
        }
        break;
      case TYPE_UINT32:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_171c = Reflection::GetRepeatedUInt32(this,message,field,value_1._4_4_);
        }
        else {
          local_171c = Reflection::GetUInt32(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteUInt32ToArray(iVar6,local_171c,(uint8_t *)stream_local);
        break;
      case TYPE_ENUM:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_18b0 = Reflection::GetRepeatedEnum(this,message,field,value_1._4_4_);
        }
        else {
          local_18b0 = Reflection::GetEnum(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        iVar7 = EnumValueDescriptor::number(local_18b0);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteEnumToArray(iVar6,iVar7,(uint8_t *)stream_local);
        break;
      case TYPE_SFIXED32:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_17bc = Reflection::GetRepeatedInt32(this,message,field,value_1._4_4_);
        }
        else {
          local_17bc = Reflection::GetInt32(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSFixed32ToArray
                                 (iVar6,local_17bc,(uint8_t *)stream_local);
        break;
      case TYPE_SFIXED64:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_17e8 = Reflection::GetRepeatedInt64(this,message,field,value_1._4_4_);
        }
        else {
          local_17e8 = Reflection::GetInt64(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSFixed64ToArray
                                 (iVar6,local_17e8,(uint8_t *)stream_local);
        break;
      case TYPE_SINT32:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_16cc = Reflection::GetRepeatedInt32(this,message,field,value_1._4_4_);
        }
        else {
          local_16cc = Reflection::GetInt32(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSInt32ToArray(iVar6,local_16cc,(uint8_t *)stream_local);
        break;
      case MAX_TYPE:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_16f8 = Reflection::GetRepeatedInt64(this,message,field,value_1._4_4_);
        }
        else {
          local_16f8 = Reflection::GetInt64(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSInt64ToArray(iVar6,local_16f8,(uint8_t *)stream_local);
      }
    }
    field_local = (FieldDescriptor *)stream_local;
  }
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::~vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
             *)local_e50);
  return (uint8_t *)field_local;
}

Assistant:

uint8_t* WireFormat::InternalSerializeField(const FieldDescriptor* field,
                                            const Message& message,
                                            uint8_t* target,
                                            io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return InternalSerializeMessageSetItem(field, message, target, stream);
  }


  // For map fields, we can use either repeated field reflection or map
  // reflection.  Our choice has some subtle effects.  If we use repeated field
  // reflection here, then the repeated field representation becomes
  // authoritative for this field: any existing references that came from map
  // reflection remain valid for reading, but mutations to them are lost and
  // will be overwritten next time we call map reflection!
  //
  // So far this mainly affects Python, which keeps long-term references to map
  // values around, and always uses map reflection.  See: b/35918691
  //
  // Here we choose to use map reflection API as long as the internal
  // map is valid. In this way, the serialization doesn't change map field's
  // internal state and existing references that came from map reflection remain
  // valid for both reading and writing.
  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      if (stream->IsSerializationDeterministic()) {
        std::vector<MapKey> sorted_key_list =
            MapKeySorter::SortKey(message, message_reflection, field);
        for (std::vector<MapKey>::iterator it = sorted_key_list.begin();
             it != sorted_key_list.end(); ++it) {
          MapValueConstRef map_value;
          message_reflection->LookupMapValue(message, field, *it, &map_value);
          target =
              InternalSerializeMapEntry(field, *it, map_value, target, stream);
        }
      } else {
        for (MapIterator it = message_reflection->MapBegin(
                 const_cast<Message*>(&message), field);
             it !=
             message_reflection->MapEnd(const_cast<Message*>(&message), field);
             ++it) {
          target = InternalSerializeMapEntry(field, it.GetKey(),
                                             it.GetValueRef(), target, stream);
        }
      }

      return target;
    }
  }
  int count = 0;

  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  // map_entries is for maps that'll be deterministically serialized.
  std::vector<const Message*> map_entries;
  if (count > 1 && field->is_map() && stream->IsSerializationDeterministic()) {
    map_entries =
        DynamicMapSorter::Sort(message, count, message_reflection, field);
  }

  if (field->is_packed()) {
    if (count == 0) return target;
    target = stream->EnsureSpace(target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    auto r =                                                                   \
        message_reflection->GetRepeatedFieldInternal<CPPTYPE>(message, field); \
    target = stream->Write##TYPE_METHOD##Packed(                               \
        field->number(), r, FieldDataOnlyByteSize(field, message), target);    \
    break;                                                                     \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32_t, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64_t, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32_t, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64_t, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t, UInt64, UInt64)
      HANDLE_PRIMITIVE_TYPE(ENUM, int, Enum, Enum)

#undef HANDLE_PRIMITIVE_TYPE
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    auto r =                                                                   \
        message_reflection->GetRepeatedFieldInternal<CPPTYPE>(message, field); \
    target = stream->WriteFixedPacked(field->number(), r, target);             \
    break;                                                                     \
  }

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32_t, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64_t, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32_t, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64_t, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE
      default:
        ABSL_LOG(FATAL) << "Invalid descriptor";
    }
    return target;
  }

  auto get_message_from_field = [&message, &map_entries, message_reflection](
                                    const FieldDescriptor* field, int j) {
    if (!field->is_repeated()) {
      return &message_reflection->GetMessage(message, field);
    }
    if (!map_entries.empty()) {
      return map_entries[j];
    }
    return &message_reflection->GetRepeatedMessage(message, field, j);
  };
  for (int j = 0; j < count; j++) {
    target = stream->EnsureSpace(target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)     \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    const CPPTYPE value =                                                     \
        field->is_repeated()                                                  \
            ? message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                              j)              \
            : message_reflection->Get##CPPTYPE_METHOD(message, field);        \
    target = WireFormatLite::Write##TYPE_METHOD##ToArray(field->number(),     \
                                                         value, target);      \
    break;                                                                    \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32_t, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64_t, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32_t, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64_t, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t, UInt64, UInt64)

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32_t, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64_t, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32_t, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64_t, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE

      case FieldDescriptor::TYPE_GROUP: {
        auto* msg = get_message_from_field(field, j);
        target = WireFormatLite::InternalWriteGroup(field->number(), *msg,
                                                    target, stream);
      } break;

      case FieldDescriptor::TYPE_MESSAGE: {
        auto* msg = get_message_from_field(field, j);
        target = WireFormatLite::InternalWriteMessage(
            field->number(), *msg, msg->GetCachedSize(), target, stream);
      } break;

      case FieldDescriptor::TYPE_ENUM: {
        const EnumValueDescriptor* value =
            field->is_repeated()
                ? message_reflection->GetRepeatedEnum(message, field, j)
                : message_reflection->GetEnum(message, field);
        target = WireFormatLite::WriteEnumToArray(field->number(),
                                                  value->number(), target);
        break;
      }

      // Handle strings separately so that we can get string references
      // instead of copying.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = field->requires_utf8_validation();
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        if (strict_utf8_check) {
          WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                           WireFormatLite::SERIALIZE,
                                           field->full_name());
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), SERIALIZE,
                                     field->full_name());
        }
        target = stream->WriteString(field->number(), value, target);
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
          absl::Cord value = message_reflection->GetCord(message, field);
          target = stream->WriteString(field->number(), value, target);
          break;
        }
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        target = stream->WriteString(field->number(), value, target);
        break;
      }
    }
  }
  return target;
}